

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectList.cpp
# Opt level: O3

bool __thiscall ObjectList::CreateBoundingBox(ObjectList *this,float t_start,float t_end,AABB *aabb)

{
  char cVar1;
  int iVar2;
  long lVar3;
  AABB _temp_aabb;
  AABB local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if ((this->m_size < 1) ||
     (iVar2 = (*(*this->m_list)->_vptr_Object[3])(*this->m_list,&local_60), (char)iVar2 == '\0')) {
    cVar1 = '\0';
  }
  else {
    *(undefined8 *)((aabb->m_max).e + 1) = local_60.m_max.e._4_8_;
    *(undefined8 *)(aabb->m_min).e = local_60.m_min.e._0_8_;
    *(undefined8 *)((aabb->m_min).e + 2) = local_60._8_8_;
    cVar1 = '\x01';
    if (1 < this->m_size) {
      lVar3 = 1;
      do {
        iVar2 = (*this->m_list[lVar3]->_vptr_Object[3])(t_start,t_end,this->m_list[lVar3],&local_60)
        ;
        cVar1 = (char)iVar2;
        if (cVar1 == '\0') {
          return false;
        }
        AABB::Merge(aabb,&local_60);
        *(undefined8 *)((aabb->m_max).e + 1) = local_38;
        *(undefined8 *)(aabb->m_min).e = local_48;
        *(undefined8 *)((aabb->m_min).e + 2) = uStack_40;
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->m_size);
    }
  }
  return (bool)cVar1;
}

Assistant:

bool 
ObjectList::CreateBoundingBox(float t_start, float t_end, AABB& aabb) const
{
    if(m_size < 1) {
        return false;
    }

    AABB _temp_aabb;
    if(m_list[0]->CreateBoundingBox(t_start, t_end, _temp_aabb)) {
        aabb = _temp_aabb;
    }
    else {
        return false;
    }

    for (int i = 1; i < m_size; i++) {
        if(!m_list[i]->CreateBoundingBox(t_start, t_end, _temp_aabb)) {
            return false;
        }
        aabb = AABB::Merge(aabb, _temp_aabb);
    }

    return true;
}